

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemv.hpp
# Opt level: O3

void remora::bindings::
     gemv_impl<remora::vector<double,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::vector<double,remora::cpu_tag>>
               (double alpha,long *A,long *x,long *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  
  lVar1 = *A;
  if (lVar1 != 0) {
    lVar2 = A[1];
    lVar3 = 0;
    lVar4 = 0;
    do {
      if (lVar2 != 0) {
        dVar6 = 0.0;
        lVar5 = 0;
        do {
          dVar6 = dVar6 + *(double *)(A[2] + lVar3 + lVar5 * 8) * *(double *)(*x + lVar5 * 8);
          lVar5 = lVar5 + 1;
        } while (lVar2 != lVar5);
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          *(double *)(*result + lVar4 * 8) = dVar6 * alpha + *(double *)(*result + lVar4 * 8);
        }
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + lVar2 * 8;
    } while (lVar4 != lVar1);
  }
  return;
}

Assistant:

void gemv_impl(
	matrix_expression<MatA, cpu_tag> const& A,
	vector_expression<V, cpu_tag> const& x,
	vector_expression<ResultV, cpu_tag>& result, 
	typename ResultV::value_type alpha,
	row_major
) {
	typedef typename ResultV::value_type value_type;
	value_type value;
	for(std::size_t i = 0; i != A().size1();++i){
		bindings::dot(row(A,i), x, value,  typename MatA::evaluation_category::tag(), typename V::evaluation_category::tag());
		if(value != value_type())//handling of sparse results.
			result()(i) += alpha * value;
	}
}